

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_drop.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalDrop::GetData
          (PhysicalDrop *this,ExecutionContext *context,DataChunk *chunk,OperatorSourceInput *input)

{
  char cVar1;
  size_t sVar2;
  ClientContext *pCVar3;
  int iVar4;
  pointer pDVar5;
  ClientData *pCVar6;
  iterator iVar7;
  pointer pEVar8;
  SecretManager *this_00;
  pointer pDVar9;
  pointer this_01;
  CatalogSearchEntry *pCVar10;
  Catalog *pCVar11;
  type pDVar12;
  unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *this_02;
  Value VStack_68;
  
  this_02 = &this->info;
  pDVar5 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     (this_02);
  cVar1 = (pDVar5->super_ParseInfo).field_0x9;
  if (cVar1 == '\x02') {
    pCVar3 = context->client;
    pDVar5 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    pCVar11 = Catalog::GetCatalog(pCVar3,&pDVar5->catalog);
    pCVar3 = context->client;
    pDVar12 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator*
                        (this_02);
    Catalog::DropEntry(pCVar11,pCVar3,pDVar12);
    pCVar6 = ClientData::Get(context->client);
    this_01 = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
              ::operator->(&pCVar6->catalog_search_path);
    pCVar10 = CatalogSearchPath::GetDefault(this_01);
    pDVar5 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    sVar2 = (pDVar5->catalog)._M_string_length;
    if (sVar2 == (pCVar10->catalog)._M_string_length) {
      if ((sVar2 != 0) &&
         (iVar4 = bcmp((pDVar5->catalog)._M_dataplus._M_p,(pCVar10->catalog)._M_dataplus._M_p,sVar2)
         , iVar4 != 0)) {
        return FINISHED;
      }
      pDVar5 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_02);
      sVar2 = (pCVar10->schema)._M_string_length;
      if (sVar2 == (pDVar5->name)._M_string_length) {
        if ((sVar2 != 0) &&
           (iVar4 = bcmp((pCVar10->schema)._M_dataplus._M_p,(pDVar5->name)._M_dataplus._M_p,sVar2),
           iVar4 != 0)) {
          return FINISHED;
        }
        pCVar3 = context->client;
        Value::Value(&VStack_68,"main");
        SchemaSetting::SetLocal(pCVar3,&VStack_68);
        Value::~Value(&VStack_68);
      }
    }
  }
  else if (cVar1 == 'G') {
    pDVar5 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    pEVar8 = unique_ptr<duckdb::ExtraDropInfo,_std::default_delete<duckdb::ExtraDropInfo>,_true>::
             operator->(&pDVar5->extra_drop_info);
    this_00 = SecretManager::Get(context->client);
    pCVar3 = context->client;
    pDVar5 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    pDVar9 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    SecretManager::DropSecretByName
              (this_00,pCVar3,&pDVar5->name,pDVar9->if_not_found,pEVar8->field_0x9,
               (string *)(pEVar8 + 1));
  }
  else if (cVar1 == '\x05') {
    pCVar6 = ClientData::Get(context->client);
    pDVar5 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    iVar7 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(pCVar6->prepared_statements)._M_h,&pDVar5->name);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      pDVar5 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                         (this_02);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_erase(&(pCVar6->prepared_statements)._M_h,&pDVar5->name);
    }
  }
  else {
    pCVar3 = context->client;
    pDVar5 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                       (this_02);
    pCVar11 = Catalog::GetCatalog(pCVar3,&pDVar5->catalog);
    pCVar3 = context->client;
    pDVar12 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator*
                        (this_02);
    Catalog::DropEntry(pCVar11,pCVar3,pDVar12);
  }
  return FINISHED;
}

Assistant:

SourceResultType PhysicalDrop::GetData(ExecutionContext &context, DataChunk &chunk, OperatorSourceInput &input) const {
	switch (info->type) {
	case CatalogType::PREPARED_STATEMENT: {
		// DEALLOCATE silently ignores errors
		auto &statements = ClientData::Get(context.client).prepared_statements;
		if (statements.find(info->name) != statements.end()) {
			statements.erase(info->name);
		}
		break;
	}
	case CatalogType::SCHEMA_ENTRY: {
		auto &catalog = Catalog::GetCatalog(context.client, info->catalog);
		catalog.DropEntry(context.client, *info);

		// Check if the dropped schema was set as the current schema
		auto &client_data = ClientData::Get(context.client);
		auto &default_entry = client_data.catalog_search_path->GetDefault();
		auto &current_catalog = default_entry.catalog;
		auto &current_schema = default_entry.schema;
		D_ASSERT(info->name != DEFAULT_SCHEMA);

		if (info->catalog == current_catalog && current_schema == info->name) {
			// Reset the schema to default
			SchemaSetting::SetLocal(context.client, DEFAULT_SCHEMA);
		}
		break;
	}
	case CatalogType::SECRET_ENTRY: {
		// Note: the schema param is used to optionally pass the storage to drop from
		D_ASSERT(info->extra_drop_info);
		auto &extra_info = info->extra_drop_info->Cast<ExtraDropSecretInfo>();
		SecretManager::Get(context.client)
		    .DropSecretByName(context.client, info->name, info->if_not_found, extra_info.persist_mode,
		                      extra_info.secret_storage);
		break;
	}
	default: {
		auto &catalog = Catalog::GetCatalog(context.client, info->catalog);
		catalog.DropEntry(context.client, *info);
		break;
	}
	}

	return SourceResultType::FINISHED;
}